

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

bool CheckCheatmode(bool printmsg)

{
  bool bVar1;
  int iVar2;
  bool printmsg_local;
  
  iVar2 = G_SkillProperty(SKILLP_DisableCheats);
  if ((((iVar2 != 0) || ((netgame & 1U) != 0)) ||
      (iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 != 0)) &&
     (bVar1 = FBoolCVar::operator_cast_to_bool(&sv_cheats), !bVar1)) {
    if (printmsg) {
      Printf("sv_cheats must be true to enable this command.\n");
    }
    return true;
  }
  return false;
}

Assistant:

bool CheckCheatmode (bool printmsg)
{
	if ((G_SkillProperty(SKILLP_DisableCheats) || netgame || deathmatch) && (!sv_cheats))
	{
		if (printmsg) Printf ("sv_cheats must be true to enable this command.\n");
		return true;
	}
	else
	{
		return false;
	}
}